

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_factory.cpp
# Opt level: O2

void __thiscall
cpp_db::driver_factory::register_driver
          (driver_factory *this,string *name,driver_creator_function *creator)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>
  local_60;
  
  std::mutex::lock(&this->factory_mutex);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>
  ::
  pair<std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_&,_true>
            (&local_60,name,creator);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>
  ::~pair(&local_60);
  pthread_mutex_unlock((pthread_mutex_t *)&this->factory_mutex);
  return;
}

Assistant:

void driver_factory::register_driver(const std::string &name, driver_factory::driver_creator_function creator)
{
    std::lock_guard<std::mutex> lg(factory_mutex);
    drivers.insert(std::make_pair(name, creator));
}